

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O3

void __thiscall
Parallelepiped::Parallelepiped
          (Parallelepiped *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,vec3 *v3,vec3 *v4,vec3 *v5,
          vec3 *v6,vec3 *v7,bool nOut,ColorRGB c)

{
  SceneObject::SceneObject(&this->super_SceneObject,ltw,c);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__Parallelepiped_0010bd18;
  (this->triangles).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangles).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triangles).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->v6).field_0 = 0;
  *(undefined8 *)((long)&(this->v6).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->v7).field_0 + 4) = 0;
  *(undefined8 *)&(this->v2).field_0 = 0;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->v3).field_0 + 4) = 0;
  *(undefined8 *)&(this->v4).field_0 = 0;
  *(undefined8 *)((long)&(this->v4).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->v5).field_0 + 4) = 0;
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->v1).field_0 + 4) = 0;
  (this->v0).field_0.field_0.x = (v0->field_0).field_0.x;
  (this->v0).field_0.field_0.y = (v0->field_0).field_0.y;
  (this->v0).field_0.field_0.z = (v0->field_0).field_0.z;
  (this->v1).field_0.field_0.x = (v1->field_0).field_0.x;
  (this->v1).field_0.field_0.y = (v1->field_0).field_0.y;
  (this->v1).field_0.field_0.z = (v1->field_0).field_0.z;
  (this->v2).field_0.field_0.x = (v2->field_0).field_0.x;
  (this->v2).field_0.field_0.y = (v2->field_0).field_0.y;
  (this->v2).field_0.field_0.z = (v2->field_0).field_0.z;
  (this->v3).field_0.field_0.x = (v3->field_0).field_0.x;
  (this->v3).field_0.field_0.y = (v3->field_0).field_0.y;
  (this->v3).field_0.field_0.z = (v3->field_0).field_0.z;
  (this->v4).field_0.field_0.x = (v4->field_0).field_0.x;
  (this->v4).field_0.field_0.y = (v4->field_0).field_0.y;
  (this->v4).field_0.field_0.z = (v4->field_0).field_0.z;
  (this->v5).field_0.field_0.x = (v5->field_0).field_0.x;
  (this->v5).field_0.field_0.y = (v5->field_0).field_0.y;
  (this->v5).field_0.field_0.z = (v5->field_0).field_0.z;
  (this->v6).field_0.field_0.x = (v6->field_0).field_0.x;
  (this->v6).field_0.field_0.y = (v6->field_0).field_0.y;
  (this->v6).field_0.field_0.z = (v6->field_0).field_0.z;
  (this->v7).field_0.field_0.x = (v7->field_0).field_0.x;
  (this->v7).field_0.field_0.y = (v7->field_0).field_0.y;
  (this->v7).field_0.field_0.z = (v7->field_0).field_0.z;
  this->normalsOut = nOut;
  _calculateTriangles(this);
  return;
}

Assistant:

Parallelepiped::Parallelepiped(
        const glm::mat4 &ltw,
        glm::vec3 v0, 
        glm::vec3 v1, 
        glm::vec3 v2, 
        glm::vec3 v3, 
        glm::vec3 v4, 
        glm::vec3 v5, 
        glm::vec3 v6, 
        glm::vec3 v7,
        bool nOut,
        ColorRGB c) : SceneObject(ltw, c) {
    
    this->v0 = v0;
    this->v1 = v1;
    this->v2 = v2;
    this->v3 = v3;
    this->v4 = v4;
    this->v5 = v5;
    this->v6 = v6;
    this->v7 = v7;
    normalsOut = nOut;
    
    _calculateTriangles();
}